

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlTextWriterWriteAttributeNS(void)

{
  int iVar1;
  int iVar2;
  xmlTextWriterPtr val;
  xmlChar *val_00;
  xmlChar *val_01;
  xmlChar *val_02;
  xmlChar *val_03;
  int local_64;
  int n_content;
  xmlChar *content;
  int n_namespaceURI;
  xmlChar *namespaceURI;
  int n_name;
  xmlChar *name;
  int n_prefix;
  xmlChar *prefix;
  int n_writer;
  xmlTextWriterPtr writer;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (prefix._4_4_ = 0; (int)prefix._4_4_ < 2; prefix._4_4_ = prefix._4_4_ + 1) {
    for (name._4_4_ = 0; (int)name._4_4_ < 5; name._4_4_ = name._4_4_ + 1) {
      for (namespaceURI._4_4_ = 0; (int)namespaceURI._4_4_ < 5;
          namespaceURI._4_4_ = namespaceURI._4_4_ + 1) {
        for (content._4_4_ = 0; (int)content._4_4_ < 5; content._4_4_ = content._4_4_ + 1) {
          for (local_64 = 0; local_64 < 5; local_64 = local_64 + 1) {
            iVar1 = xmlMemBlocks();
            val = gen_xmlTextWriterPtr(prefix._4_4_,0);
            val_00 = gen_const_xmlChar_ptr(name._4_4_,1);
            val_01 = gen_const_xmlChar_ptr(namespaceURI._4_4_,2);
            val_02 = gen_const_xmlChar_ptr(content._4_4_,3);
            val_03 = gen_const_xmlChar_ptr(local_64,4);
            iVar2 = xmlTextWriterWriteAttributeNS(val,val_00,val_01,val_02,val_03);
            desret_int(iVar2);
            call_tests = call_tests + 1;
            des_xmlTextWriterPtr(prefix._4_4_,val,0);
            des_const_xmlChar_ptr(name._4_4_,val_00,1);
            des_const_xmlChar_ptr(namespaceURI._4_4_,val_01,2);
            des_const_xmlChar_ptr(content._4_4_,val_02,3);
            des_const_xmlChar_ptr(local_64,val_03,4);
            xmlResetLastError();
            iVar2 = xmlMemBlocks();
            if (iVar1 != iVar2) {
              iVar2 = xmlMemBlocks();
              printf("Leak of %d blocks found in xmlTextWriterWriteAttributeNS",
                     (ulong)(uint)(iVar2 - iVar1));
              ret_val = ret_val + 1;
              printf(" %d",(ulong)prefix._4_4_);
              printf(" %d",(ulong)name._4_4_);
              printf(" %d",(ulong)namespaceURI._4_4_);
              printf(" %d",(ulong)content._4_4_);
              printf(" %d");
              printf("\n");
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlTextWriterWriteAttributeNS(void) {
    int test_ret = 0;

#if defined(LIBXML_WRITER_ENABLED)
    int mem_base;
    int ret_val;
    xmlTextWriterPtr writer; /* the xmlTextWriterPtr */
    int n_writer;
    xmlChar * prefix; /* namespace prefix */
    int n_prefix;
    xmlChar * name; /* attribute local name */
    int n_name;
    xmlChar * namespaceURI; /* namespace URI */
    int n_namespaceURI;
    xmlChar * content; /* attribute content */
    int n_content;

    for (n_writer = 0;n_writer < gen_nb_xmlTextWriterPtr;n_writer++) {
    for (n_prefix = 0;n_prefix < gen_nb_const_xmlChar_ptr;n_prefix++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_namespaceURI = 0;n_namespaceURI < gen_nb_const_xmlChar_ptr;n_namespaceURI++) {
    for (n_content = 0;n_content < gen_nb_const_xmlChar_ptr;n_content++) {
        mem_base = xmlMemBlocks();
        writer = gen_xmlTextWriterPtr(n_writer, 0);
        prefix = gen_const_xmlChar_ptr(n_prefix, 1);
        name = gen_const_xmlChar_ptr(n_name, 2);
        namespaceURI = gen_const_xmlChar_ptr(n_namespaceURI, 3);
        content = gen_const_xmlChar_ptr(n_content, 4);

        ret_val = xmlTextWriterWriteAttributeNS(writer, (const xmlChar *)prefix, (const xmlChar *)name, (const xmlChar *)namespaceURI, (const xmlChar *)content);
        desret_int(ret_val);
        call_tests++;
        des_xmlTextWriterPtr(n_writer, writer, 0);
        des_const_xmlChar_ptr(n_prefix, (const xmlChar *)prefix, 1);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 2);
        des_const_xmlChar_ptr(n_namespaceURI, (const xmlChar *)namespaceURI, 3);
        des_const_xmlChar_ptr(n_content, (const xmlChar *)content, 4);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlTextWriterWriteAttributeNS",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_writer);
            printf(" %d", n_prefix);
            printf(" %d", n_name);
            printf(" %d", n_namespaceURI);
            printf(" %d", n_content);
            printf("\n");
        }
    }
    }
    }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}